

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_MultiGFab.H
# Opt level: O0

void __thiscall amrex::EB2::GFab::define(GFab *this,Box *vbx)

{
  IntVect *pIVar1;
  undefined8 uVar2;
  Box *pBVar3;
  int aiVar4 [2];
  int iVar5;
  int iVar6;
  int iVar7;
  int *in_RSI;
  undefined8 *in_RDI;
  Box bx_2;
  Box bx_1;
  int idim;
  Box bx;
  Box result;
  Box *bxg2;
  int i;
  IntVect shft;
  IntVect shft_1;
  size_type in_stack_fffffffffffffb18;
  array<amrex::BaseFab<unsigned_int>,_3UL> *in_stack_fffffffffffffb20;
  Arena *in_stack_fffffffffffffb38;
  Arena *pAVar8;
  Arena *pAVar9;
  undefined8 in_stack_fffffffffffffb40;
  int n;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  BaseFab<double> *in_stack_fffffffffffffb50;
  int local_458;
  int iStack_454;
  int local_450;
  int local_448 [2];
  int local_440;
  int local_434;
  int iStack_430;
  int local_42c;
  undefined1 local_428 [68];
  int iStack_3e4;
  int local_3e0;
  Arena local_3d8;
  uint auStack_3c0 [3];
  int local_3b4;
  int local_3b0 [2];
  undefined8 local_3a8;
  int local_3a0 [2];
  undefined4 local_398;
  Box local_394;
  Box *local_378;
  Box *local_360;
  int local_354;
  int *local_350;
  int local_344;
  undefined4 *local_340;
  undefined4 local_338;
  int local_334;
  long local_330;
  int local_324;
  undefined4 *local_320;
  int local_318;
  undefined4 local_314;
  int local_308 [2];
  int local_300;
  int local_2f8;
  IntVect local_2f4;
  int local_2e8 [2];
  int local_2e0;
  int local_2d8;
  IntVect local_2d4;
  undefined4 *local_2c8;
  array<amrex::BaseFab<unsigned_int>,_3UL> *local_2c0;
  Box *local_2b8;
  IntVect *local_2b0;
  Box *local_2a8;
  int local_2a0 [2];
  int local_298;
  IntVect local_28c;
  _func_int **local_280;
  int local_278;
  int *local_270;
  int *local_268;
  _func_int **local_260;
  int local_258;
  undefined4 local_254;
  int *local_250;
  undefined4 local_244;
  int *local_240;
  undefined4 local_234;
  int *local_230;
  IndexType local_224;
  int local_220 [2];
  int local_218;
  int local_210 [2];
  int local_208;
  int local_200;
  int iStack_1fc;
  int local_1f8;
  int local_1f0 [2];
  int local_1e8;
  IntVect *local_1e0;
  Arena *local_1d8;
  int *local_1d0;
  int *local_1c8;
  undefined4 local_1bc;
  int *local_1b8;
  undefined4 local_1ac;
  int *local_1a8;
  undefined4 local_19c;
  int *local_198;
  int local_190 [2];
  int local_188;
  uint *local_180;
  IntVect local_174;
  int local_168 [2];
  int local_160;
  int *local_158;
  IntVect *local_150;
  IntVect local_148;
  undefined4 local_13c;
  int *local_138;
  undefined4 local_12c;
  int *local_128;
  undefined4 local_11c;
  int *local_118;
  IndexType local_10c;
  int local_108 [2];
  int local_100;
  int local_f8 [2];
  int local_f0;
  int local_e8;
  int iStack_e4;
  int local_e0;
  int local_dc;
  int iStack_d8;
  int local_d4;
  array<amrex::BaseFab<unsigned_int>,_3UL> *local_d0;
  undefined1 *local_c8;
  int *local_c0;
  undefined1 *local_b8;
  undefined4 local_ac;
  int *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  int *local_88;
  int local_80 [2];
  int local_78;
  undefined1 *local_70;
  IntVect local_64;
  int local_58 [2];
  int local_50;
  int *local_48;
  array<amrex::BaseFab<unsigned_int>,_3UL> *local_40;
  IntVect local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffb40 >> 0x20);
  *in_RDI = *(undefined8 *)in_RSI;
  in_RDI[1] = *(undefined8 *)(in_RSI + 2);
  in_RDI[2] = *(undefined8 *)(in_RSI + 4);
  *(int *)(in_RDI + 3) = in_RSI[6];
  local_314 = 2;
  local_394.smallend.vect._0_8_ = *(undefined8 *)in_RSI;
  local_394._8_8_ = *(undefined8 *)(in_RSI + 2);
  local_394.bigend.vect._4_8_ = *(undefined8 *)(in_RSI + 4);
  local_394.btype.itype = in_RSI[6];
  Box::grow(&local_394,2);
  local_378 = &local_394;
  local_3b0[0] = local_394.smallend.vect[0];
  local_3b0[1] = local_394.smallend.vect[1];
  local_3a8._0_4_ = local_394.smallend.vect[2];
  local_3a8._4_4_ = local_394.bigend.vect[0];
  local_3a0[0] = local_394.bigend.vect[1];
  local_3a0[1] = local_394.bigend.vect[2];
  local_350 = local_3b0;
  for (local_354 = 0; local_354 < 3; local_354 = local_354 + 1) {
    local_340 = &local_398;
    local_344 = local_354;
    local_324 = local_354;
    local_318 = local_354;
    if ((local_394.btype.itype & 1 << ((byte)local_354 & 0x1f)) == 0) {
      local_330 = (long)&local_3a8 + 4;
      local_334 = local_354;
      local_338 = 1;
      *(int *)(local_330 + (long)local_354 * 4) = *(int *)(local_330 + (long)local_354 * 4) + 1;
    }
    local_320 = local_340;
  }
  local_2c8 = &local_398;
  local_398 = 7;
  local_360 = local_378;
  BaseFab<double>::resize
            (in_stack_fffffffffffffb50,
             (Box *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),iVar5,
             in_stack_fffffffffffffb38);
  for (local_3b4 = 0; local_3b4 < 3; local_3b4 = local_3b4 + 1) {
    std::array<amrex::BaseFab<unsigned_int>,_3UL>::operator[]
              (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    pBVar3 = local_378;
    local_2d8 = local_3b4;
    if (local_3b4 == 0) {
      IntVect::IntVect(&local_2d4,1,0,0);
    }
    else if (local_3b4 == 1) {
      IntVect::IntVect(&local_2d4,0,1,0);
    }
    else {
      IntVect::IntVect(&local_2d4,0,0,1);
    }
    local_2e0 = local_2d4.vect[2];
    local_2e8[0] = local_2d4.vect[0];
    local_2e8[1] = local_2d4.vect[1];
    local_428._56_4_ = local_2d4.vect[2];
    local_428._48_4_ = local_2d4.vect[0];
    local_428._52_4_ = local_2d4.vect[1];
    local_3e0 = local_2d4.vect[2];
    local_428._64_4_ = local_2d4.vect[0];
    iStack_3e4 = local_2d4.vect[1];
    local_2a8 = pBVar3;
    pIVar1 = (IntVect *)(local_428 + 0x40);
    local_3d8._vptr_Arena = *(_func_int ***)(pBVar3->smallend).vect;
    uVar2 = *(undefined8 *)((pBVar3->smallend).vect + 2);
    unique0x10000358 = *(undefined8 *)((pBVar3->bigend).vect + 2);
    local_3d8.arena_info._8_4_ = SUB84((ulong)*(undefined8 *)(pBVar3->bigend).vect >> 0x20,0);
    local_3d8.arena_info.release_threshold._0_4_ = (undefined4)uVar2;
    local_3d8.arena_info.release_threshold._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    pAVar8 = &local_3d8;
    local_180 = auStack_3c0;
    pAVar9 = pAVar8;
    local_2b0 = pIVar1;
    local_1e0 = pIVar1;
    local_1d8 = pAVar8;
    IntVect::IntVect(&local_174,auStack_3c0[0] & 1,auStack_3c0[0] >> 1 & 1,auStack_3c0[0] >> 2 & 1);
    n = (int)((ulong)pAVar9 >> 0x20);
    local_188 = local_174.vect[2];
    local_190[0] = local_174.vect[0];
    local_190[1] = local_174.vect[1];
    local_208 = local_174.vect[2];
    local_210[0] = local_174.vect[0];
    local_210[1] = local_174.vect[1];
    local_1f8 = local_174.vect[2];
    local_200 = local_174.vect[0];
    iStack_1fc = local_174.vect[1];
    uVar2 = _local_200;
    local_158 = &local_200;
    local_11c = 0;
    local_200 = local_174.vect[0];
    iVar6 = local_428._64_4_ - local_200;
    local_12c = 1;
    iStack_1fc = local_174.vect[1];
    iVar5 = iStack_3e4 - iStack_1fc;
    local_13c = 2;
    _local_200 = uVar2;
    local_150 = pIVar1;
    local_138 = local_158;
    local_128 = local_158;
    local_118 = local_158;
    IntVect::IntVect(&local_148,iVar6,iVar5,local_3e0 - local_174.vect[2]);
    local_160 = local_148.vect[2];
    local_168[0] = local_148.vect[0];
    local_168[1] = local_148.vect[1];
    local_218 = local_148.vect[2];
    local_220[0] = local_148.vect[0];
    local_220[1] = local_148.vect[1];
    local_1e8 = local_148.vect[2];
    local_1f0[0] = local_148.vect[0];
    local_1f0[1] = local_148.vect[1];
    aiVar4 = local_1f0;
    local_1c8 = (int *)((long)&(pAVar8->arena_info).release_threshold + 4);
    local_1d0 = local_1f0;
    local_19c = 0;
    local_1f0[0] = local_148.vect[0];
    iVar5 = *local_1c8 + local_1f0[0];
    pAVar9 = pAVar8;
    local_1f0 = aiVar4;
    local_198 = local_1d0;
    *local_1c8 = iVar5;
    local_1a8 = local_1d0;
    local_1ac = 1;
    *(int *)&(pAVar8->arena_info).use_cpu_memory =
         *(int *)&(pAVar8->arena_info).use_cpu_memory + local_1d0[1];
    local_1b8 = local_1d0;
    local_1bc = 2;
    *(int *)&(pAVar8->arena_info).device_use_hostalloc =
         *(int *)&(pAVar8->arena_info).device_use_hostalloc + local_1d0[2];
    IndexType::IndexType(&local_224,local_1e0);
    *(uint *)&pAVar9[1]._vptr_Arena = local_224.itype;
    iVar5 = 1;
    BaseFab<unsigned_int>::resize
              ((BaseFab<unsigned_int> *)in_stack_fffffffffffffb50,
               (Box *)CONCAT44(1,in_stack_fffffffffffffb48),n,pAVar9);
    in_stack_fffffffffffffb50 =
         (BaseFab<double> *)
         std::array<amrex::BaseFab<unsigned_int>,_3UL>::operator[]
                   (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    pBVar3 = local_378;
    IntVect::IntVect(&local_28c,iVar5);
    local_298 = local_28c.vect[2];
    local_2a0[0] = local_28c.vect[0];
    local_2a0[1] = local_28c.vect[1];
    local_440 = local_28c.vect[2];
    local_448[0] = local_28c.vect[0];
    local_448[1] = local_28c.vect[1];
    local_434 = local_28c.vect[0];
    iStack_430 = local_28c.vect[1];
    local_42c = local_28c.vect[2];
    local_2f8 = local_3b4;
    if (local_3b4 == 0) {
      IntVect::IntVect(&local_2f4,1,0,0);
    }
    else if (local_3b4 == 1) {
      IntVect::IntVect(&local_2f4,0,1,0);
    }
    else {
      IntVect::IntVect(&local_2f4,0,0,1);
    }
    local_300 = local_2f4.vect[2];
    local_308[0] = local_2f4.vect[0];
    local_308[1] = local_2f4.vect[1];
    local_450 = local_2f4.vect[2];
    local_458 = local_2f4.vect[0];
    iStack_454 = local_2f4.vect[1];
    uVar2 = _local_458;
    local_268 = &local_434;
    local_270 = &local_458;
    local_234 = 0;
    local_458 = local_2f4.vect[0];
    iVar7 = local_434 - local_458;
    local_244 = 1;
    iStack_454 = local_2f4.vect[1];
    iVar6 = iStack_430 - iStack_454;
    local_254 = 2;
    _local_458 = uVar2;
    local_250 = local_270;
    local_240 = local_270;
    local_230 = local_270;
    IntVect::IntVect((IntVect *)&local_260,iVar7,iVar6,local_42c - local_2f4.vect[2]);
    local_278 = local_258;
    local_280 = local_260;
    local_428._8_4_ = local_258;
    local_428._0_8_ = local_260;
    local_2b8 = pBVar3;
    in_stack_fffffffffffffb20 = (array<amrex::BaseFab<unsigned_int>,_3UL> *)local_428;
    local_428._16_8_ = *(undefined8 *)(pBVar3->smallend).vect;
    uVar2 = *(undefined8 *)((pBVar3->smallend).vect + 2);
    local_428._36_8_ = *(undefined8 *)((pBVar3->bigend).vect + 2);
    local_428._32_4_ = (undefined4)((ulong)*(undefined8 *)(pBVar3->bigend).vect >> 0x20);
    local_428._24_4_ = (undefined4)uVar2;
    local_428._28_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    local_c8 = local_428 + 0x10;
    local_70 = local_428 + 0x28;
    local_2c0 = in_stack_fffffffffffffb20;
    local_d0 = in_stack_fffffffffffffb20;
    IntVect::IntVect(&local_64,local_428._40_4_ & 1,(uint)local_428._40_4_ >> 1 & 1,
                     (uint)local_428._40_4_ >> 2 & 1);
    local_78 = local_64.vect[2];
    local_80[0] = local_64.vect[0];
    local_80[1] = local_64.vect[1];
    local_f0 = local_64.vect[2];
    local_f8[0] = local_64.vect[0];
    local_f8[1] = local_64.vect[1];
    local_e0 = local_64.vect[2];
    local_e8 = local_64.vect[0];
    iStack_e4 = local_64.vect[1];
    uVar2 = _local_e8;
    local_48 = &local_e8;
    local_c = 0;
    local_e8 = local_64.vect[0];
    iVar7 = *(int *)&in_stack_fffffffffffffb20->_M_elems[0]._vptr_BaseFab - local_e8;
    local_1c = 1;
    iStack_e4 = local_64.vect[1];
    iVar6 = *(int *)((long)&in_stack_fffffffffffffb20->_M_elems[0]._vptr_BaseFab + 4) - iStack_e4;
    local_2c = 2;
    _local_e8 = uVar2;
    local_40 = in_stack_fffffffffffffb20;
    local_28 = local_48;
    local_18 = local_48;
    local_8 = local_48;
    IntVect::IntVect(&local_38,iVar7,iVar6,
                     *(int *)&in_stack_fffffffffffffb20->_M_elems[0].super_DataAllocator.m_arena -
                     local_64.vect[2]);
    local_50 = local_38.vect[2];
    local_58[0] = local_38.vect[0];
    local_58[1] = local_38.vect[1];
    local_100 = local_38.vect[2];
    local_108[0] = local_38.vect[0];
    local_108[1] = local_38.vect[1];
    local_dc = local_38.vect[0];
    iStack_d8 = local_38.vect[1];
    uVar2 = _local_dc;
    local_d4 = local_38.vect[2];
    local_b8 = local_428 + 0x1c;
    local_c0 = &local_dc;
    local_8c = 0;
    local_dc = local_38.vect[0];
    local_428._28_4_ = local_dc + local_428._28_4_;
    local_9c = 1;
    iStack_d8 = local_38.vect[1];
    local_428._32_4_ = iStack_d8 + local_428._32_4_;
    local_ac = 2;
    local_428._36_4_ = local_38.vect[2] + local_428._36_4_;
    _local_dc = uVar2;
    local_a8 = local_c0;
    local_98 = local_c0;
    local_88 = local_c0;
    IndexType::IndexType(&local_10c,(IntVect *)local_d0);
    local_428._40_4_ = local_10c.itype;
    BaseFab<unsigned_int>::resize
              ((BaseFab<unsigned_int> *)in_stack_fffffffffffffb50,
               (Box *)CONCAT44(iVar5,in_stack_fffffffffffffb48),n,pAVar9);
  }
  return;
}

Assistant:

void define(const Box& vbx) {
        m_validbox = vbx;
        const Box& bxg2 = amrex::grow(vbx,ng);
        m_levelset.resize(amrex::surroundingNodes(bxg2));
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            m_facetype[idim].resize(amrex::convert(bxg2,IntVect::TheDimensionVector(idim)));
#if (AMREX_SPACEDIM == 3)
            m_edgetype[idim].resize(amrex::convert(bxg2,IntVect::TheNodeVector()
                                                       -IntVect::TheDimensionVector(idim)));
#endif
        }
    }